

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

void on_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  uv_process_options_t *puVar6;
  int extraout_EDX;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  ulong unaff_RBP;
  long *plVar10;
  long *plVar11;
  undefined1 **ppuVar12;
  uv_process_options_t *unaff_R14;
  undefined8 unaff_R15;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 *puStack_f40;
  uv_process_options_t *puStack_f38;
  undefined8 uStack_f30;
  code *pcStack_f28;
  long lStack_f20;
  long lStack_f18;
  uv_process_options_t *puStack_f10;
  long lStack_f00;
  long lStack_ef8;
  uv_process_options_t *puStack_ef0;
  uv_process_options_t *puStack_ee8;
  long lStack_ed8;
  long lStack_ed0;
  undefined4 uStack_ec4;
  uv_stdio_container_t uStack_ec0;
  undefined4 uStack_eb0;
  undefined4 uStack_ea8;
  undefined4 uStack_ea0;
  undefined4 uStack_e98;
  undefined4 uStack_e90;
  undefined4 uStack_e88;
  undefined1 auStack_e80 [16];
  uv_process_options_t *puStack_e70;
  undefined8 uStack_e68;
  long lStack_e60;
  undefined1 auStack_e58 [208];
  code *pcStack_d88;
  long lStack_d80;
  long lStack_d78;
  uv_stdio_container_t uStack_d70;
  undefined4 uStack_d60;
  undefined4 uStack_d50;
  undefined4 uStack_d40;
  uv_process_options_t *puStack_d38;
  uv_process_options_t auStack_d28 [2];
  undefined1 *puStack_c40;
  anon_union_8_2_13e1ed65_for_data aStack_c38;
  code *pcStack_c30;
  undefined8 uStack_c20;
  code *pcStack_c18;
  long lStack_c10;
  long lStack_c08;
  char *pcStack_c00;
  undefined8 uStack_bf8;
  char acStack_bf0 [32];
  uv_stdio_container_t uStack_bd0;
  undefined4 uStack_bc0;
  undefined1 *puStack_bb8;
  long alStack_ba8 [25];
  undefined1 auStack_ae0 [232];
  undefined1 auStack_9f8 [232];
  char *pcStack_910;
  uv_process_options_t *puStack_908;
  code *pcStack_900;
  undefined8 uStack_8f8;
  long lStack_8e8;
  long lStack_8e0;
  undefined1 auStack_8d8 [16];
  uv_stdio_container_t uStack_8c8;
  undefined4 uStack_8b8;
  uint uStack_8b0;
  undefined4 uStack_8a8;
  uint uStack_8a0;
  uv_process_options_t uStack_890;
  uint uStack_838;
  char *pcStack_6d0;
  uv_process_options_t *puStack_6c8;
  undefined1 auStack_690 [16];
  uv_stdio_container_t uStack_680;
  undefined4 uStack_670;
  uint uStack_668;
  undefined4 uStack_660;
  uint uStack_658;
  uv_process_options_t uStack_650;
  int iStack_5f8;
  char *pcStack_490;
  uv_process_options_t *puStack_488;
  undefined1 auStack_458 [16];
  uv_stdio_container_t uStack_448;
  undefined4 uStack_438;
  uint uStack_430;
  undefined4 uStack_428;
  uint uStack_420;
  uv_process_options_t uStack_410;
  uint uStack_3b8;
  char *pcStack_250;
  uv_process_options_t *puStack_248;
  undefined8 uStack_240;
  long lStack_230;
  long lStack_228;
  undefined1 auStack_220 [16];
  uv_stdio_container_t uStack_210;
  undefined4 uStack_200;
  uint uStack_1f8;
  uv_process_options_t uStack_1e8;
  uint uStack_190;
  
  if (0 < nread) {
    output_used = output_used + (int)nread;
    return;
  }
  if (-1 < nread) {
    return;
  }
  if (nread == -0xfff) {
    uv_close(tcp,close_cb);
    return;
  }
  on_read_cold_1();
  pcVar7 = "stdout_file";
  puStack_248 = (uv_process_options_t *)0x1bf0ea;
  unlink("stdout_file");
  puStack_248 = (uv_process_options_t *)0x1bf0fd;
  init_process_options("spawn_helper2",exit_cb);
  puStack_248 = (uv_process_options_t *)0x1bf11a;
  iVar1 = uv_fs_open(0,&uStack_1e8,"stdout_file",0x42,0x180,0);
  uStack_210._0_8_ = SEXT48(iVar1);
  auStack_220._0_8_ = 0;
  if (uStack_210._0_8_ == 0) {
    pcVar7 = (char *)(ulong)uStack_190;
    puStack_248 = (uv_process_options_t *)0x1bf147;
    uv_fs_req_cleanup();
    options.stdio = &uStack_210;
    unaff_R14 = &options;
    uStack_210._0_8_ = uStack_210._0_8_ & 0xffffffff00000000;
    uStack_200 = 2;
    uStack_1f8 = uStack_190;
    options.stdio_count = 2;
    puStack_248 = (uv_process_options_t *)0x1bf176;
    uVar4 = uv_default_loop();
    puStack_248 = (uv_process_options_t *)0x1bf188;
    iVar1 = uv_spawn(uVar4,&process,&options);
    auStack_220._0_8_ = SEXT48(iVar1);
    lStack_230 = 0;
    if (auStack_220._0_8_ != 0) goto LAB_001bf386;
    puStack_248 = (uv_process_options_t *)0x1bf1ad;
    uVar4 = uv_default_loop();
    puStack_248 = (uv_process_options_t *)0x1bf1b7;
    iVar1 = uv_run(uVar4,0);
    auStack_220._0_8_ = SEXT48(iVar1);
    lStack_230 = 0;
    if (auStack_220._0_8_ != 0) goto LAB_001bf395;
    auStack_220._0_8_ = 1;
    lStack_230 = (long)exit_cb_called;
    if (lStack_230 != 1) goto LAB_001bf3a4;
    auStack_220._0_8_ = 1;
    lStack_230 = (long)close_cb_called;
    if (lStack_230 != 1) goto LAB_001bf3b3;
    puStack_248 = (uv_process_options_t *)0x1bf232;
    auStack_220 = uv_buf_init(output,0x400);
    uStack_240 = 0;
    puStack_248 = (uv_process_options_t *)0x1bf25d;
    iVar1 = uv_fs_read(0,&uStack_1e8,uStack_190,auStack_220,1,0);
    lStack_230 = 0xc;
    lStack_228 = (long)iVar1;
    if (lStack_228 != 0xc) goto LAB_001bf3c2;
    unaff_R14 = &uStack_1e8;
    puStack_248 = (uv_process_options_t *)0x1bf28a;
    uv_fs_req_cleanup(unaff_R14);
    puStack_248 = (uv_process_options_t *)0x1bf298;
    iVar1 = uv_fs_close(0,unaff_R14,pcVar7,0);
    lStack_230 = (long)iVar1;
    lStack_228 = 0;
    if (lStack_230 != 0) goto LAB_001bf3d1;
    puStack_248 = (uv_process_options_t *)0x1bf2c2;
    uv_fs_req_cleanup(&uStack_1e8);
    pcVar7 = output;
    puStack_248 = (uv_process_options_t *)0x1bf2da;
    printf("output is: %s",output);
    puStack_248 = (uv_process_options_t *)0x1bf2e9;
    iVar1 = strcmp("hello world\n",output);
    lStack_230 = (long)iVar1;
    lStack_228 = 0;
    if (lStack_230 != 0) goto LAB_001bf3e0;
    puStack_248 = (uv_process_options_t *)0x1bf315;
    unlink("stdout_file");
    puStack_248 = (uv_process_options_t *)0x1bf31a;
    pcVar7 = (char *)uv_default_loop();
    puStack_248 = (uv_process_options_t *)0x1bf32e;
    uv_walk(pcVar7,close_walk_cb,0);
    puStack_248 = (uv_process_options_t *)0x1bf338;
    uv_run(pcVar7,0);
    lStack_230 = 0;
    puStack_248 = (uv_process_options_t *)0x1bf346;
    uVar4 = uv_default_loop();
    puStack_248 = (uv_process_options_t *)0x1bf34e;
    iVar1 = uv_loop_close(uVar4);
    lStack_228 = (long)iVar1;
    if (lStack_230 == lStack_228) {
      puStack_248 = (uv_process_options_t *)0x1bf36a;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_248 = (uv_process_options_t *)0x1bf386;
    run_test_spawn_stdout_to_file_cold_1();
LAB_001bf386:
    puStack_248 = (uv_process_options_t *)0x1bf395;
    run_test_spawn_stdout_to_file_cold_2();
LAB_001bf395:
    puStack_248 = (uv_process_options_t *)0x1bf3a4;
    run_test_spawn_stdout_to_file_cold_3();
LAB_001bf3a4:
    puStack_248 = (uv_process_options_t *)0x1bf3b3;
    run_test_spawn_stdout_to_file_cold_4();
LAB_001bf3b3:
    puStack_248 = (uv_process_options_t *)0x1bf3c2;
    run_test_spawn_stdout_to_file_cold_5();
LAB_001bf3c2:
    puStack_248 = (uv_process_options_t *)0x1bf3d1;
    run_test_spawn_stdout_to_file_cold_6();
LAB_001bf3d1:
    puStack_248 = (uv_process_options_t *)0x1bf3e0;
    run_test_spawn_stdout_to_file_cold_7();
LAB_001bf3e0:
    puStack_248 = (uv_process_options_t *)0x1bf3ef;
    run_test_spawn_stdout_to_file_cold_8();
  }
  puStack_248 = (uv_process_options_t *)run_test_spawn_stdout_and_stderr_to_file;
  run_test_spawn_stdout_to_file_cold_9();
  pcVar8 = "stdout_file";
  pcStack_250 = pcVar7;
  puStack_248 = unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar1 = uv_fs_open(0,&uStack_410,"stdout_file",0x42,0x180,0);
  uStack_448._0_8_ = SEXT48(iVar1);
  auStack_458._0_8_ = 0;
  if (uStack_448._0_8_ == 0) {
    pcVar8 = (char *)(ulong)uStack_3b8;
    uv_fs_req_cleanup();
    options.stdio = &uStack_448;
    unaff_R14 = &options;
    uStack_448._0_8_ = uStack_448._0_8_ & 0xffffffff00000000;
    uStack_438 = 2;
    uStack_430 = uStack_3b8;
    uStack_428 = 2;
    uStack_420 = uStack_3b8;
    options.stdio_count = 3;
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    auStack_458._0_8_ = SEXT48(iVar1);
    if (auStack_458._0_8_ != 0) goto LAB_001bf6bd;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    auStack_458._0_8_ = SEXT48(iVar1);
    if (auStack_458._0_8_ != 0) goto LAB_001bf6cc;
    auStack_458._0_8_ = 1;
    if (exit_cb_called != 1) goto LAB_001bf6db;
    auStack_458._0_8_ = 1;
    if (close_cb_called != 1) goto LAB_001bf6ea;
    auStack_458 = uv_buf_init(output,0x400);
    iVar1 = uv_fs_read(0,&uStack_410,pcVar8,auStack_458,1,0);
    if (iVar1 != 0x1b) goto LAB_001bf6f9;
    unaff_R14 = &uStack_410;
    uv_fs_req_cleanup(unaff_R14);
    iVar1 = uv_fs_close(0,unaff_R14,uStack_3b8,0);
    if (iVar1 != 0) goto LAB_001bf708;
    uv_fs_req_cleanup(&uStack_410);
    pcVar8 = output;
    printf("output is: %s",output);
    iVar1 = strcmp("hello world\nhello errworld\n",output);
    if (iVar1 != 0) goto LAB_001bf717;
    unlink("stdout_file");
    pcVar8 = (char *)uv_default_loop();
    uv_walk(pcVar8,close_walk_cb,0);
    uv_run(pcVar8,0);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_spawn_stdout_and_stderr_to_file_cold_1();
LAB_001bf6bd:
    run_test_spawn_stdout_and_stderr_to_file_cold_2();
LAB_001bf6cc:
    run_test_spawn_stdout_and_stderr_to_file_cold_3();
LAB_001bf6db:
    run_test_spawn_stdout_and_stderr_to_file_cold_4();
LAB_001bf6ea:
    run_test_spawn_stdout_and_stderr_to_file_cold_5();
LAB_001bf6f9:
    run_test_spawn_stdout_and_stderr_to_file_cold_6();
LAB_001bf708:
    run_test_spawn_stdout_and_stderr_to_file_cold_7();
LAB_001bf717:
    run_test_spawn_stdout_and_stderr_to_file_cold_8();
  }
  run_test_spawn_stdout_and_stderr_to_file_cold_9();
  pcVar7 = "stdout_file";
  pcStack_490 = pcVar8;
  puStack_488 = unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar1 = uv_fs_open(0,&uStack_650,"stdout_file",0x42,0x180,0);
  uStack_680._0_8_ = SEXT48(iVar1);
  auStack_690._0_8_ = 0;
  if (uStack_680._0_8_ == 0) {
    uv_fs_req_cleanup();
    unaff_RBP = 2;
    uVar2 = dup2(iStack_5f8,2);
    pcVar7 = (char *)(ulong)uVar2;
    uStack_680._0_8_ = SEXT48((int)uVar2);
    auStack_690._0_8_ = -1;
    if (uStack_680._0_8_ == -1) goto LAB_001bfa24;
    options.stdio = &uStack_680;
    unaff_R14 = &options;
    uStack_680._4_4_ = (int)uVar2 >> 0x1f;
    uStack_680._0_8_ = (ulong)(uint)uStack_680._4_4_ << 0x20;
    uStack_670 = 2;
    uStack_660 = 2;
    options.stdio_count = 3;
    uStack_668 = uVar2;
    uStack_658 = uVar2;
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    auStack_690._0_8_ = SEXT48(iVar1);
    if (auStack_690._0_8_ != 0) goto LAB_001bfa33;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    auStack_690._0_8_ = SEXT48(iVar1);
    if (auStack_690._0_8_ != 0) goto LAB_001bfa42;
    auStack_690._0_8_ = 1;
    if (exit_cb_called != 1) goto LAB_001bfa51;
    auStack_690._0_8_ = 1;
    if (close_cb_called != 1) goto LAB_001bfa60;
    auStack_690 = uv_buf_init(output,0x400);
    iVar1 = uv_fs_read(0,&uStack_650,pcVar7,auStack_690,1,0);
    if (iVar1 != 0x1b) goto LAB_001bfa6f;
    unaff_R14 = &uStack_650;
    uv_fs_req_cleanup(unaff_R14);
    iVar1 = uv_fs_close(0,unaff_R14,uVar2,0);
    if (iVar1 != 0) goto LAB_001bfa7e;
    uv_fs_req_cleanup(&uStack_650);
    pcVar7 = output;
    printf("output is: %s",output);
    iVar1 = strcmp("hello world\nhello errworld\n",output);
    if (iVar1 != 0) goto LAB_001bfa8d;
    unlink("stdout_file");
    pcVar7 = (char *)uv_default_loop();
    uv_walk(pcVar7,close_walk_cb,0);
    uv_run(pcVar7,0);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_spawn_stdout_and_stderr_to_file2_cold_1();
LAB_001bfa24:
    run_test_spawn_stdout_and_stderr_to_file2_cold_10();
LAB_001bfa33:
    run_test_spawn_stdout_and_stderr_to_file2_cold_2();
LAB_001bfa42:
    run_test_spawn_stdout_and_stderr_to_file2_cold_3();
LAB_001bfa51:
    run_test_spawn_stdout_and_stderr_to_file2_cold_4();
LAB_001bfa60:
    run_test_spawn_stdout_and_stderr_to_file2_cold_5();
LAB_001bfa6f:
    run_test_spawn_stdout_and_stderr_to_file2_cold_6();
LAB_001bfa7e:
    run_test_spawn_stdout_and_stderr_to_file2_cold_7();
LAB_001bfa8d:
    run_test_spawn_stdout_and_stderr_to_file2_cold_8();
  }
  run_test_spawn_stdout_and_stderr_to_file2_cold_9();
  pcVar8 = "stdout_file";
  pcStack_900 = (code *)0x1bfac7;
  pcStack_6d0 = pcVar7;
  puStack_6c8 = unaff_R14;
  unlink("stdout_file");
  pcStack_900 = (code *)0x1bfad3;
  unlink("stderr_file");
  pcStack_900 = (code *)0x1bfae6;
  init_process_options("spawn_helper6",exit_cb);
  pcStack_900 = (code *)0x1bfb03;
  iVar1 = uv_fs_open(0,&uStack_890,"stdout_file",0x42,0x180,0);
  uVar2 = uStack_838;
  uStack_8c8._0_8_ = SEXT48(iVar1);
  auStack_8d8._0_8_ = 0;
  if (uStack_8c8._0_8_ == 0) {
    pcVar8 = (char *)(ulong)uStack_838;
    pcStack_900 = (code *)0x1bfb30;
    uv_fs_req_cleanup();
    pcStack_900 = (code *)0x1bfb3c;
    uVar2 = dup2(uVar2,1);
    unaff_RBP = (ulong)uVar2;
    uStack_8c8._0_8_ = SEXT48((int)uVar2);
    auStack_8d8._0_8_ = -1;
    if (uStack_8c8._0_8_ == -1) goto LAB_001bff0f;
    pcStack_900 = (code *)0x1bfb7f;
    iVar1 = uv_fs_open(0,&uStack_890,"stderr_file",0x42,0x180,0);
    uStack_8c8._0_8_ = SEXT48(iVar1);
    auStack_8d8._0_8_ = 0;
    if (uStack_8c8._0_8_ != 0) goto LAB_001bff1e;
    pcStack_900 = (code *)0x1bfbac;
    uv_fs_req_cleanup();
    unaff_R15 = 2;
    pcStack_900 = (code *)0x1bfbbe;
    uVar3 = dup2(uStack_838,2);
    pcVar8 = (char *)(ulong)uVar3;
    uStack_8c8._0_8_ = SEXT48((int)uVar3);
    auStack_8d8._0_8_ = -1;
    if (uStack_8c8._0_8_ == -1) goto LAB_001bff2d;
    options.stdio = &uStack_8c8;
    unaff_R14 = &options;
    uStack_8c8._4_4_ = (int)uVar3 >> 0x1f;
    uStack_8c8._0_8_ = (ulong)(uint)uStack_8c8._4_4_ << 0x20;
    uStack_8b8 = 2;
    uStack_8a8 = 2;
    options.stdio_count = 3;
    pcStack_900 = (code *)0x1bfc16;
    uStack_8b0 = uVar3;
    uStack_8a0 = uVar2;
    uVar4 = uv_default_loop();
    pcStack_900 = (code *)0x1bfc28;
    iVar1 = uv_spawn(uVar4,&process,&options);
    auStack_8d8._0_8_ = SEXT48(iVar1);
    lStack_8e8 = 0;
    if (auStack_8d8._0_8_ != 0) goto LAB_001bff3c;
    pcStack_900 = (code *)0x1bfc4d;
    uVar4 = uv_default_loop();
    pcStack_900 = (code *)0x1bfc57;
    iVar1 = uv_run(uVar4,0);
    auStack_8d8._0_8_ = SEXT48(iVar1);
    lStack_8e8 = 0;
    if (auStack_8d8._0_8_ != 0) goto LAB_001bff4b;
    auStack_8d8._0_8_ = 1;
    lStack_8e8 = (long)exit_cb_called;
    if (lStack_8e8 != 1) goto LAB_001bff5a;
    auStack_8d8._0_8_ = 1;
    lStack_8e8 = (long)close_cb_called;
    if (lStack_8e8 != 1) goto LAB_001bff69;
    pcStack_900 = (code *)0x1bfcd2;
    auStack_8d8 = uv_buf_init(output,0x400);
    uStack_8f8 = 0;
    pcStack_900 = (code *)0x1bfcfd;
    iVar1 = uv_fs_read(0,&uStack_890,uVar2,auStack_8d8,1,0);
    lStack_8e8 = (long)iVar1;
    lStack_8e0 = 0xf;
    pcVar7 = (char *)unaff_R14;
    if (lStack_8e8 < 0xf) goto LAB_001bff78;
    pcVar7 = (char *)&uStack_890;
    pcStack_900 = (code *)0x1bfd2a;
    uv_fs_req_cleanup(pcVar7);
    pcStack_900 = (code *)0x1bfd38;
    iVar1 = uv_fs_close(0,pcVar7,unaff_RBP,0);
    lStack_8e8 = (long)iVar1;
    lStack_8e0 = 0;
    if (lStack_8e8 != 0) goto LAB_001bff87;
    pcStack_900 = (code *)0x1bfd62;
    uv_fs_req_cleanup(&uStack_890);
    pcVar7 = output;
    pcStack_900 = (code *)0x1bfd7a;
    printf("output is: %s",output);
    pcStack_900 = (code *)0x1bfd8e;
    iVar1 = strncmp("hello errworld\n",output,0xf);
    lStack_8e8 = (long)iVar1;
    lStack_8e0 = 0;
    if (lStack_8e8 != 0) goto LAB_001bff96;
    uStack_8f8 = 0;
    pcStack_900 = (code *)0x1bfdd2;
    iVar1 = uv_fs_read(0,&uStack_890,uVar3,auStack_8d8,1,0);
    lStack_8e8 = (long)iVar1;
    lStack_8e0 = 0xc;
    if (lStack_8e8 < 0xc) goto LAB_001bffa5;
    pcVar7 = (char *)&uStack_890;
    pcStack_900 = (code *)0x1bfdff;
    uv_fs_req_cleanup(pcVar7);
    pcStack_900 = (code *)0x1bfe0d;
    iVar1 = uv_fs_close(0,pcVar7,pcVar8,0);
    lStack_8e8 = (long)iVar1;
    lStack_8e0 = 0;
    if (lStack_8e8 != 0) goto LAB_001bffb4;
    pcStack_900 = (code *)0x1bfe37;
    uv_fs_req_cleanup(&uStack_890);
    pcVar8 = output;
    pcStack_900 = (code *)0x1bfe4f;
    printf("output is: %s",output);
    pcStack_900 = (code *)0x1bfe63;
    iVar1 = strncmp("hello world\n",output,0xc);
    lStack_8e8 = (long)iVar1;
    lStack_8e0 = 0;
    if (lStack_8e8 != 0) goto LAB_001bffc3;
    pcStack_900 = (code *)0x1bfe8f;
    unlink("stdout_file");
    pcStack_900 = (code *)0x1bfe9b;
    unlink("stderr_file");
    pcStack_900 = (code *)0x1bfea0;
    pcVar8 = (char *)uv_default_loop();
    pcStack_900 = (code *)0x1bfeb4;
    uv_walk(pcVar8,close_walk_cb,0);
    pcStack_900 = (code *)0x1bfebe;
    uv_run(pcVar8,0);
    lStack_8e8 = 0;
    pcStack_900 = (code *)0x1bfecc;
    uVar4 = uv_default_loop();
    pcStack_900 = (code *)0x1bfed4;
    iVar1 = uv_loop_close(uVar4);
    lStack_8e0 = (long)iVar1;
    if (lStack_8e8 == lStack_8e0) {
      pcStack_900 = (code *)0x1bfef0;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_900 = (code *)0x1bff0f;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_001bff0f:
    pcStack_900 = (code *)0x1bff1e;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_001bff1e:
    pcStack_900 = (code *)0x1bff2d;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_001bff2d:
    pcStack_900 = (code *)0x1bff3c;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_001bff3c:
    pcStack_900 = (code *)0x1bff4b;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_001bff4b:
    pcStack_900 = (code *)0x1bff5a;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_001bff5a:
    pcStack_900 = (code *)0x1bff69;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_001bff69:
    pcStack_900 = (code *)0x1bff78;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
    pcVar7 = (char *)unaff_R14;
LAB_001bff78:
    pcStack_900 = (code *)0x1bff87;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_001bff87:
    pcStack_900 = (code *)0x1bff96;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_001bff96:
    pcStack_900 = (code *)0x1bffa5;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_001bffa5:
    pcStack_900 = (code *)0x1bffb4;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_001bffb4:
    pcStack_900 = (code *)0x1bffc3;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_001bffc3:
    pcStack_900 = (code *)0x1bffd2;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  pcStack_900 = run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  iVar9 = (int)&lStack_c10;
  builtin_strncpy(acStack_bf0,"hello-from-spawn_stdin",0x17);
  pcStack_c18 = (code *)0x1c001b;
  pcStack_910 = pcVar8;
  puStack_908 = (uv_process_options_t *)pcVar7;
  pcStack_900 = (code *)unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  pcStack_c18 = (code *)0x1c0020;
  uVar4 = uv_default_loop();
  puVar5 = auStack_9f8;
  pcStack_c18 = (code *)0x1c0035;
  uv_pipe_init(uVar4,puVar5,0);
  pcStack_c18 = (code *)0x1c003a;
  uVar4 = uv_default_loop();
  pcStack_c18 = (code *)0x1c004f;
  uv_pipe_init(uVar4,(uv_stream_t *)auStack_ae0,0);
  options.stdio = &uStack_bd0;
  uStack_bd0.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  uStack_bc0 = 0x21;
  options.stdio_count = 2;
  pcStack_c18 = (code *)0x1c0086;
  uStack_bd0.data.stream = (uv_stream_t *)auStack_ae0;
  puStack_bb8 = puVar5;
  uVar4 = uv_default_loop();
  pcStack_c18 = (code *)0x1c0098;
  iVar1 = uv_spawn(uVar4,&process,&options);
  alStack_ba8[0] = (long)iVar1;
  pcStack_c00 = (char *)0x0;
  if (alStack_ba8[0] == 0) {
    pcStack_c00 = acStack_bf0;
    uStack_bf8 = 0x17;
    pcStack_c18 = (code *)0x1c00eb;
    iVar1 = uv_write(alStack_ba8,auStack_ae0,&pcStack_c00,1,write_cb);
    lStack_c08 = (long)iVar1;
    lStack_c10 = 0;
    if (lStack_c08 != 0) goto LAB_001c0251;
    pcStack_c18 = (code *)0x1c0124;
    iVar1 = uv_read_start(auStack_9f8,on_alloc,on_read);
    lStack_c08 = (long)iVar1;
    lStack_c10 = 0;
    if (lStack_c08 != 0) goto LAB_001c025e;
    pcStack_c18 = (code *)0x1c0147;
    uVar4 = uv_default_loop();
    pcStack_c18 = (code *)0x1c0151;
    iVar1 = uv_run(uVar4,0);
    lStack_c08 = (long)iVar1;
    lStack_c10 = 0;
    if (lStack_c08 != 0) goto LAB_001c026b;
    lStack_c08 = 1;
    lStack_c10 = (long)exit_cb_called;
    if (lStack_c10 != 1) goto LAB_001c0278;
    lStack_c08 = 3;
    lStack_c10 = (long)close_cb_called;
    if (lStack_c10 != 3) goto LAB_001c0285;
    pcStack_c18 = (code *)0x1c01c6;
    iVar1 = strcmp(acStack_bf0,output);
    lStack_c08 = (long)iVar1;
    lStack_c10 = 0;
    if (lStack_c08 != 0) goto LAB_001c0292;
    pcStack_c18 = (code *)0x1c01e9;
    puVar5 = (undefined1 *)uv_default_loop();
    pcStack_c18 = (code *)0x1c01fd;
    uv_walk(puVar5,close_walk_cb,0);
    pcStack_c18 = (code *)0x1c0207;
    uv_run(puVar5,0);
    lStack_c08 = 0;
    pcStack_c18 = (code *)0x1c0215;
    uVar4 = uv_default_loop();
    pcStack_c18 = (code *)0x1c021d;
    iVar1 = uv_loop_close(uVar4);
    lStack_c10 = (long)iVar1;
    if (lStack_c08 == lStack_c10) {
      pcStack_c18 = (code *)0x1c0233;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_c18 = (code *)0x1c0251;
    run_test_spawn_stdin_cold_1();
LAB_001c0251:
    pcStack_c18 = (code *)0x1c025e;
    run_test_spawn_stdin_cold_2();
LAB_001c025e:
    pcStack_c18 = (code *)0x1c026b;
    run_test_spawn_stdin_cold_3();
LAB_001c026b:
    pcStack_c18 = (code *)0x1c0278;
    run_test_spawn_stdin_cold_4();
LAB_001c0278:
    pcStack_c18 = (code *)0x1c0285;
    run_test_spawn_stdin_cold_5();
LAB_001c0285:
    pcStack_c18 = (code *)0x1c0292;
    run_test_spawn_stdin_cold_6();
LAB_001c0292:
    pcStack_c18 = (code *)0x1c029f;
    run_test_spawn_stdin_cold_7();
  }
  plVar10 = &lStack_c08;
  pcStack_c18 = write_cb;
  run_test_spawn_stdin_cold_8();
  pcStack_c18 = (code *)(long)iVar9;
  uStack_c20 = 0;
  if (pcStack_c18 == (code *)0x0) {
    uv_close(plVar10[0xb],close_cb);
    return;
  }
  pcStack_c30 = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  pcStack_d88 = (code *)0x1c030e;
  puStack_c40 = puVar5;
  aStack_c38.stream = (uv_stream_t *)auStack_ae0;
  pcStack_c30 = (code *)unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  pcStack_d88 = (code *)0x1c0313;
  uVar4 = uv_default_loop();
  puVar6 = auStack_d28;
  pcStack_d88 = (code *)0x1c0327;
  uv_pipe_init(uVar4,puVar6,0);
  options.stdio = &uStack_d70;
  uStack_d70.flags = UV_IGNORE;
  uStack_d60 = 0;
  uStack_d50 = 0;
  uStack_d40 = 0x21;
  options.stdio_count = 4;
  pcStack_d88 = (code *)0x1c035c;
  puStack_d38 = puVar6;
  uVar4 = uv_default_loop();
  pcStack_d88 = (code *)0x1c036e;
  iVar1 = uv_spawn(uVar4,&process,&options);
  lStack_d78 = (long)iVar1;
  lStack_d80 = 0;
  if (lStack_d78 == 0) {
    pcStack_d88 = (code *)0x1c03a4;
    iVar1 = uv_read_start(auStack_d28,on_alloc,on_read);
    lStack_d78 = (long)iVar1;
    lStack_d80 = 0;
    if (lStack_d78 != 0) goto LAB_001c04e4;
    pcStack_d88 = (code *)0x1c03c7;
    uVar4 = uv_default_loop();
    pcStack_d88 = (code *)0x1c03d1;
    iVar1 = uv_run(uVar4,0);
    lStack_d78 = (long)iVar1;
    lStack_d80 = 0;
    if (lStack_d78 != 0) goto LAB_001c04f1;
    lStack_d78 = 1;
    lStack_d80 = (long)exit_cb_called;
    if (lStack_d80 != 1) goto LAB_001c04fe;
    lStack_d78 = 2;
    lStack_d80 = (long)close_cb_called;
    if (lStack_d80 != 2) goto LAB_001c050b;
    pcStack_d88 = (code *)0x1c044d;
    printf("output from stdio[3] is: %s",output);
    pcStack_d88 = (code *)0x1c045c;
    iVar1 = strcmp("fourth stdio!\n",output);
    lStack_d78 = (long)iVar1;
    lStack_d80 = 0;
    puVar6 = (uv_process_options_t *)output;
    if (lStack_d78 != 0) goto LAB_001c0518;
    pcStack_d88 = (code *)0x1c047f;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    pcStack_d88 = (code *)0x1c0493;
    uv_walk(puVar6,close_walk_cb,0);
    pcStack_d88 = (code *)0x1c049d;
    uv_run(puVar6,0);
    lStack_d78 = 0;
    pcStack_d88 = (code *)0x1c04ab;
    uVar4 = uv_default_loop();
    pcStack_d88 = (code *)0x1c04b3;
    iVar1 = uv_loop_close(uVar4);
    lStack_d80 = (long)iVar1;
    if (lStack_d78 == lStack_d80) {
      pcStack_d88 = (code *)0x1c04c9;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_d88 = (code *)0x1c04e4;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_001c04e4:
    pcStack_d88 = (code *)0x1c04f1;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_001c04f1:
    pcStack_d88 = (code *)0x1c04fe;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_001c04fe:
    pcStack_d88 = (code *)0x1c050b;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_001c050b:
    pcStack_d88 = (code *)0x1c0518;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_001c0518:
    pcStack_d88 = (code *)0x1c0525;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  pcStack_d88 = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStack_e70 = (uv_process_options_t *)0x1c053e;
  uVar4 = uv_default_loop();
  puStack_e70 = (uv_process_options_t *)0x1c054b;
  iVar1 = uv_tcp_init(uVar4,auStack_e58);
  lStack_e60 = (long)iVar1;
  uStack_e68 = 0;
  if (lStack_e60 == 0) {
    puStack_e70 = (uv_process_options_t *)0x1c0574;
    iVar1 = uv_tcp_open(auStack_e58,3);
    lStack_e60 = (long)iVar1;
    uStack_e68 = 0;
    if (lStack_e60 != 0) goto LAB_001c05d3;
    puStack_e70 = (uv_process_options_t *)0x1c059f;
    iVar1 = uv_listen(auStack_e58,0x1000,0);
    lStack_e60 = (long)iVar1;
    uStack_e68 = 0;
    if (lStack_e60 == 0) {
      return;
    }
  }
  else {
    puStack_e70 = (uv_process_options_t *)0x1c05d3;
    spawn_tcp_server_helper_cold_1();
LAB_001c05d3:
    puStack_e70 = (uv_process_options_t *)0x1c05e0;
    spawn_tcp_server_helper_cold_2();
  }
  puStack_e70 = (uv_process_options_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStack_ee8 = (uv_process_options_t *)0x1c0605;
  puStack_e70 = puVar6;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  puStack_ee8 = (uv_process_options_t *)0x1c061b;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_e80);
  uStack_ec0._0_8_ = SEXT48(iVar1);
  lStack_ed8 = 0;
  if (uStack_ec0._0_8_ == 0) {
    puStack_ee8 = (uv_process_options_t *)0x1c0640;
    uVar4 = uv_default_loop();
    puStack_ee8 = (uv_process_options_t *)0x1c0654;
    iVar1 = uv_tcp_init_ex(uVar4,&tcp_server,2);
    uStack_ec0._0_8_ = SEXT48(iVar1);
    lStack_ed8 = 0;
    if (uStack_ec0._0_8_ != 0) goto LAB_001c0839;
    puStack_ee8 = (uv_process_options_t *)0x1c0687;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_e80,0);
    uStack_ec0._0_8_ = SEXT48(iVar1);
    lStack_ed8 = 0;
    if (uStack_ec0._0_8_ != 0) goto LAB_001c0848;
    puStack_ee8 = (uv_process_options_t *)0x1c06b8;
    iVar1 = uv_fileno(&tcp_server,&uStack_ec4);
    uStack_ec0._0_8_ = SEXT48(iVar1);
    lStack_ed8 = 0;
    if (uStack_ec0._0_8_ != 0) goto LAB_001c0857;
    options.stdio = &uStack_ec0;
    puVar6 = &options;
    uStack_ec0._4_4_ = iVar1 >> 0x1f;
    uStack_ec0.flags = 2;
    uStack_ec0.data.file = 0;
    uStack_eb0 = 2;
    uStack_ea8 = 1;
    uStack_ea0 = 2;
    uStack_e98 = 2;
    uStack_e90 = 2;
    uStack_e88 = uStack_ec4;
    options.stdio_count = 4;
    puStack_ee8 = (uv_process_options_t *)0x1c0722;
    uVar4 = uv_default_loop();
    puStack_ee8 = (uv_process_options_t *)0x1c0734;
    iVar1 = uv_spawn(uVar4,&process,&options);
    lStack_ed8 = (long)iVar1;
    lStack_ed0 = 0;
    if (lStack_ed8 != 0) goto LAB_001c0866;
    puStack_ee8 = (uv_process_options_t *)0x1c0759;
    uVar4 = uv_default_loop();
    puStack_ee8 = (uv_process_options_t *)0x1c0763;
    iVar1 = uv_run(uVar4,0);
    lStack_ed8 = (long)iVar1;
    lStack_ed0 = 0;
    if (lStack_ed8 != 0) goto LAB_001c0875;
    lStack_ed8 = 1;
    lStack_ed0 = (long)exit_cb_called;
    if (lStack_ed0 != 1) goto LAB_001c0884;
    lStack_ed8 = 1;
    lStack_ed0 = (long)close_cb_called;
    if (lStack_ed0 != 1) goto LAB_001c0893;
    puStack_ee8 = (uv_process_options_t *)0x1c07d2;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    puStack_ee8 = (uv_process_options_t *)0x1c07e6;
    uv_walk(puVar6,close_walk_cb,0);
    puStack_ee8 = (uv_process_options_t *)0x1c07f0;
    uv_run(puVar6,0);
    lStack_ed8 = 0;
    puStack_ee8 = (uv_process_options_t *)0x1c07fe;
    uVar4 = uv_default_loop();
    puStack_ee8 = (uv_process_options_t *)0x1c0806;
    iVar1 = uv_loop_close(uVar4);
    lStack_ed0 = (long)iVar1;
    if (lStack_ed8 == lStack_ed0) {
      puStack_ee8 = (uv_process_options_t *)0x1c0822;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_ee8 = (uv_process_options_t *)0x1c0839;
    run_test_spawn_tcp_server_cold_1();
LAB_001c0839:
    puStack_ee8 = (uv_process_options_t *)0x1c0848;
    run_test_spawn_tcp_server_cold_2();
LAB_001c0848:
    puStack_ee8 = (uv_process_options_t *)0x1c0857;
    run_test_spawn_tcp_server_cold_3();
LAB_001c0857:
    puStack_ee8 = (uv_process_options_t *)0x1c0866;
    run_test_spawn_tcp_server_cold_4();
LAB_001c0866:
    puStack_ee8 = (uv_process_options_t *)0x1c0875;
    run_test_spawn_tcp_server_cold_5();
LAB_001c0875:
    puStack_ee8 = (uv_process_options_t *)0x1c0884;
    run_test_spawn_tcp_server_cold_6();
LAB_001c0884:
    puStack_ee8 = (uv_process_options_t *)0x1c0893;
    run_test_spawn_tcp_server_cold_7();
LAB_001c0893:
    puStack_ee8 = (uv_process_options_t *)0x1c08a2;
    run_test_spawn_tcp_server_cold_8();
  }
  puStack_ee8 = (uv_process_options_t *)run_test_spawn_ignored_stdio;
  run_test_spawn_tcp_server_cold_9();
  puStack_ee8 = &options;
  puStack_f10 = (uv_process_options_t *)0x1c08cb;
  puStack_ef0 = puVar6;
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  puVar6 = &options;
  options.stdio_count = 0;
  puStack_f10 = (uv_process_options_t *)0x1c08eb;
  uVar4 = uv_default_loop();
  puStack_f10 = (uv_process_options_t *)0x1c08fd;
  iVar1 = uv_spawn(uVar4,&process,&options);
  lStack_ef8 = (long)iVar1;
  lStack_f00 = 0;
  if (lStack_ef8 == 0) {
    puStack_f10 = (uv_process_options_t *)0x1c091e;
    uVar4 = uv_default_loop();
    puStack_f10 = (uv_process_options_t *)0x1c0928;
    iVar1 = uv_run(uVar4,0);
    lStack_ef8 = (long)iVar1;
    lStack_f00 = 0;
    if (lStack_ef8 != 0) goto LAB_001c09fc;
    lStack_ef8 = 1;
    lStack_f00 = (long)exit_cb_called;
    if (lStack_f00 != 1) goto LAB_001c0a0b;
    lStack_ef8 = 1;
    lStack_f00 = (long)close_cb_called;
    if (lStack_f00 != 1) goto LAB_001c0a1a;
    puStack_f10 = (uv_process_options_t *)0x1c0997;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    puStack_f10 = (uv_process_options_t *)0x1c09ab;
    uv_walk(puVar6,close_walk_cb,0);
    puStack_f10 = (uv_process_options_t *)0x1c09b5;
    uv_run(puVar6,0);
    lStack_ef8 = 0;
    puStack_f10 = (uv_process_options_t *)0x1c09c3;
    uVar4 = uv_default_loop();
    puStack_f10 = (uv_process_options_t *)0x1c09cb;
    iVar1 = uv_loop_close(uVar4);
    lStack_f00 = (long)iVar1;
    if (lStack_ef8 == lStack_f00) {
      puStack_f10 = (uv_process_options_t *)0x1c09e3;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_f10 = (uv_process_options_t *)0x1c09fc;
    run_test_spawn_ignored_stdio_cold_1();
LAB_001c09fc:
    puStack_f10 = (uv_process_options_t *)0x1c0a0b;
    run_test_spawn_ignored_stdio_cold_2();
LAB_001c0a0b:
    puStack_f10 = (uv_process_options_t *)0x1c0a1a;
    run_test_spawn_ignored_stdio_cold_3();
LAB_001c0a1a:
    puStack_f10 = (uv_process_options_t *)0x1c0a29;
    run_test_spawn_ignored_stdio_cold_4();
  }
  puStack_f10 = (uv_process_options_t *)run_test_spawn_and_kill;
  run_test_spawn_ignored_stdio_cold_5();
  plVar10 = &lStack_f20;
  pcStack_f28 = (code *)0x1c0a50;
  puStack_f10 = puVar6;
  init_process_options("spawn_helper4",kill_cb);
  pcStack_f28 = (code *)0x1c0a55;
  uVar4 = uv_default_loop();
  pcStack_f28 = (code *)0x1c0a6b;
  iVar1 = uv_spawn(uVar4,&process,&options);
  lStack_f18 = (long)iVar1;
  lStack_f20 = 0;
  if (lStack_f18 == 0) {
    pcStack_f28 = (code *)0x1c0a8e;
    uVar4 = uv_default_loop();
    pcStack_f28 = (code *)0x1c0a9d;
    iVar1 = uv_timer_init(uVar4,&timer);
    lStack_f18 = (long)iVar1;
    lStack_f20 = 0;
    if (lStack_f18 != 0) goto LAB_001c0bca;
    pcStack_f28 = (code *)0x1c0ad5;
    iVar1 = uv_timer_start(&timer,timer_cb,500,0);
    lStack_f18 = (long)iVar1;
    lStack_f20 = 0;
    if (lStack_f18 != 0) goto LAB_001c0bd7;
    pcStack_f28 = (code *)0x1c0af8;
    uVar4 = uv_default_loop();
    pcStack_f28 = (code *)0x1c0b02;
    iVar1 = uv_run(uVar4,0);
    lStack_f18 = (long)iVar1;
    lStack_f20 = 0;
    if (lStack_f18 != 0) goto LAB_001c0be4;
    lStack_f18 = 1;
    lStack_f20 = (long)exit_cb_called;
    if (lStack_f20 != 1) goto LAB_001c0bf1;
    lStack_f18 = 2;
    lStack_f20 = (long)close_cb_called;
    if (lStack_f20 != 2) goto LAB_001c0bfe;
    pcStack_f28 = (code *)0x1c0b6b;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    pcStack_f28 = (code *)0x1c0b7f;
    uv_walk(puVar6,close_walk_cb,0);
    pcStack_f28 = (code *)0x1c0b89;
    uv_run(puVar6,0);
    lStack_f18 = 0;
    pcStack_f28 = (code *)0x1c0b97;
    uVar4 = uv_default_loop();
    pcStack_f28 = (code *)0x1c0b9f;
    iVar1 = uv_loop_close(uVar4);
    lStack_f20 = (long)iVar1;
    if (lStack_f18 == lStack_f20) {
      pcStack_f28 = (code *)0x1c0bb5;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_f28 = (code *)0x1c0bca;
    run_test_spawn_and_kill_cold_1();
LAB_001c0bca:
    pcStack_f28 = (code *)0x1c0bd7;
    run_test_spawn_and_kill_cold_2();
LAB_001c0bd7:
    pcStack_f28 = (code *)0x1c0be4;
    run_test_spawn_and_kill_cold_3();
LAB_001c0be4:
    pcStack_f28 = (code *)0x1c0bf1;
    run_test_spawn_and_kill_cold_4();
LAB_001c0bf1:
    pcStack_f28 = (code *)0x1c0bfe;
    run_test_spawn_and_kill_cold_5();
LAB_001c0bfe:
    pcStack_f28 = (code *)0x1c0c0b;
    run_test_spawn_and_kill_cold_6();
  }
  plVar11 = &lStack_f18;
  pcStack_f28 = kill_cb;
  run_test_spawn_and_kill_cold_7();
  pcStack_f28 = (code *)0x0;
  uStack_f30 = 0;
  puStack_f38 = puVar6;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  puStack_f40 = (undefined1 *)plVar10;
  if (plVar10 == (long *)0x0) {
    if (extraout_EDX != 0xf) goto LAB_001c0cb9;
    uv_close(plVar11,close_cb);
    puStack_f40 = (undefined1 *)(long)(int)plVar11[9];
    if (puStack_f40 != (undefined1 *)0x0) {
      iVar1 = uv_kill(puStack_f40,0);
      puStack_f40 = (undefined1 *)(long)iVar1;
      if (puStack_f40 == (undefined1 *)0xfffffffffffffffd) {
        return;
      }
      goto LAB_001c0ccb;
    }
  }
  else {
    kill_cb_cold_1();
LAB_001c0cb9:
    kill_cb_cold_2();
  }
  kill_cb_cold_4();
LAB_001c0ccb:
  ppuVar12 = &puStack_f40;
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close(ppuVar12,close_cb);
  return;
}

Assistant:

static void on_read(uv_stream_t* handle,
                    ssize_t nread,
                    const uv_buf_t* buf) {
  int r;
  uv_pipe_t* pipe;
  uv_handle_type pending;
  uv_buf_t outbuf;

  pipe = (uv_pipe_t*) handle;

  if (nread == 0) {
    /* Everything OK, but nothing read. */
    free(buf->base);
    return;
  }

  if (nread < 0) {
    if (nread == UV_EOF) {
      free(buf->base);
      return;
    }

    printf("error recving on channel: %s\n", uv_strerror(nread));
    abort();
  }

  fprintf(stderr, "got %d bytes\n", (int)nread);

  pending = uv_pipe_pending_type(pipe);
  if (!tcp_server_listening) {
    ASSERT_EQ(1, uv_pipe_pending_count(pipe));
    ASSERT_GT(nread, 0);
    ASSERT_NOT_NULL(buf->base);
    ASSERT_NE(pending, UV_UNKNOWN_HANDLE);
    read_cb_called++;

    /* Accept the pending TCP server, and start listening on it. */
    ASSERT_EQ(pending, UV_TCP);
    r = uv_tcp_init(uv_default_loop(), &tcp_server);
    ASSERT_OK(r);

    r = uv_accept((uv_stream_t*)pipe, (uv_stream_t*)&tcp_server);
    ASSERT_OK(r);

    r = uv_listen((uv_stream_t*)&tcp_server, BACKLOG, on_connection);
    ASSERT_OK(r);

    tcp_server_listening = 1;

    /* Make sure that the expected data is correctly multiplexed. */
    ASSERT_MEM_EQ("hello\n", buf->base, nread);

    outbuf = uv_buf_init("foobar\n", 7);
    r = uv_write(&write_req, (uv_stream_t*)pipe, &outbuf, 1, NULL);
    ASSERT_OK(r);

    /* Create a bunch of connections to get both servers to accept. */
    make_many_connections();
  } else if (memcmp("accepted_connection\n", buf->base, nread) == 0) {
    /* Remote server has accepted a connection.  Close the channel. */
    ASSERT_OK(uv_pipe_pending_count(pipe));
    ASSERT_EQ(pending, UV_UNKNOWN_HANDLE);
    remote_conn_accepted = 1;
    uv_close((uv_handle_t*)&channel, NULL);
  }

  free(buf->base);
}